

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

double rand_next(size_t *next)

{
  double dVar1;
  size_t *next_local;
  
  dVar1 = rand_next_uint64(next);
  return dVar1;
}

Assistant:

double rand_next( size_t * next ) 
{
#ifdef UINT64_MAX
  #if SIZE_MAX == UINT64_MAX
    return rand_next_uint64( (uint64_t *) next );
  #elif SIZE_MAX == UINT32_MAX
    return rand_next_uint32( (uint32_t *) next );
  #endif
#else
  return rand_next_uint32( (uint32_t *) next );
#endif
}